

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputedValues.h
# Opt level: O1

void __thiscall Rml::Style::ComputedValues::ComputedValues(ComputedValues *this,Element *element)

{
  this->element = element;
  *(ulong *)&this->common = *(ulong *)&this->common & 0xfffff80000800000 | 0x15200002;
  (this->common).width_value = 0.0;
  (this->common).height_value = 0.0;
  (this->common).margin_top_value = 0.0;
  (this->common).margin_right_value = 0.0;
  (this->common).margin_bottom_value = 0.0;
  (this->common).margin_left_value = 0.0;
  (this->common).padding_top_value = 0.0;
  (this->common).padding_right_value = 0.0;
  (this->common).padding_bottom_value = 0.0;
  (this->common).padding_left_value = 0.0;
  (this->common).top_value = 0.0;
  (this->common).right_value = 0.0;
  (this->common).bottom_value = 0.0;
  (this->common).left_value = 0.0;
  (this->common).z_index_value = 0.0;
  (this->common).border_top_width = 0;
  (this->common).border_right_width = 0;
  (this->common).border_bottom_width = 0;
  (this->common).border_left_width = 0;
  (this->common).border_top_color.red = 0xff;
  (this->common).border_top_color.green = 0xff;
  (this->common).border_top_color.blue = 0xff;
  (this->common).border_top_color.alpha = 0xff;
  (this->common).border_right_color.red = 0xff;
  (this->common).border_right_color.green = 0xff;
  (this->common).border_right_color.blue = 0xff;
  (this->common).border_right_color.alpha = 0xff;
  (this->common).border_bottom_color.red = 0xff;
  (this->common).border_bottom_color.green = 0xff;
  (this->common).border_bottom_color.blue = 0xff;
  (this->common).border_bottom_color.alpha = 0xff;
  (this->common).border_left_color.red = 0xff;
  (this->common).border_left_color.green = 0xff;
  (this->common).border_left_color.blue = 0xff;
  (this->common).border_left_color.alpha = 0xff;
  (this->common).background_color.red = '\0';
  (this->common).background_color.green = '\0';
  (this->common).background_color.blue = '\0';
  (this->common).background_color.alpha = '\0';
  (this->inherited).font_face_handle = 0;
  (this->inherited).font_size = 12.0;
  (this->inherited).opacity = 1.0;
  (this->inherited).color.red = 0xff;
  (this->inherited).color.green = 0xff;
  (this->inherited).color.blue = 0xff;
  (this->inherited).color.alpha = 0xff;
  *(uint *)&(this->inherited).field_0x14 =
       *(uint *)&(this->inherited).field_0x14 & 0xc08000 | 0x6190;
  (this->inherited).line_height = 14.400001;
  (this->inherited).line_height_inherit = 1.2;
  (this->inherited).language._M_dataplus._M_p = (pointer)&(this->inherited).language.field_2;
  (this->inherited).language._M_string_length = 0;
  (this->inherited).language.field_2._M_local_buf[0] = '\0';
  *(uint *)&this->rare = *(uint *)&this->rare & 0xe000c000 | 0xf0;
  (this->rare).clip.value = '\0';
  (this->rare).min_width = 0.0;
  (this->rare).max_width = 3.4028235e+38;
  (this->rare).min_height = 0.0;
  (this->rare).max_height = 3.4028235e+38;
  (this->rare).vertical_align_length = 0.0;
  (this->rare).perspective = 0.0;
  (this->rare).perspective_origin_x = 50.0;
  (this->rare).perspective_origin_y = 50.0;
  (this->rare).transform_origin_x = 50.0;
  (this->rare).transform_origin_y = 50.0;
  (this->rare).border_top_left_radius = 0;
  (this->rare).border_top_right_radius = 0;
  (this->rare).border_bottom_right_radius = 0;
  (this->rare).border_bottom_left_radius = 0;
  (this->rare).transform_origin_z = 0.0;
  (this->rare).flex_basis = 0.0;
  (this->rare).row_gap = 0.0;
  (this->rare).column_gap = 0.0;
  (this->rare).image_color.red = 0xff;
  (this->rare).image_color.green = 0xff;
  (this->rare).image_color.blue = 0xff;
  (this->rare).image_color.alpha = 0xff;
  (this->rare).scrollbar_margin = 0.0;
  return;
}

Assistant:

explicit ComputedValues(Element* element) : element(element) {}